

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvDecodeTile(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  tmsize_t tVar2;
  bool bVar3;
  tmsize_t rowlen;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *bp_local;
  TIFF *tif_local;
  
  tVar2 = TIFFTileRowSize(tif);
  if (tVar2 == 0) {
    tif_local._4_4_ = 0;
  }
  else {
    tStack_28 = cc;
    cc_local = (tmsize_t)bp;
    if (cc % tVar2 != 0) {
      __assert_fail("cc % rowlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                    ,0x1a3,"int LogLuvDecodeTile(TIFF *, uint8_t *, tmsize_t, uint16_t)");
    }
    while( true ) {
      bVar3 = false;
      if (tStack_28 != 0) {
        iVar1 = (*tif->tif_decoderow)(tif,(uint8_t *)cc_local,tVar2,s);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      cc_local = tVar2 + cc_local;
      tStack_28 = tStack_28 - tVar2;
    }
    tif_local._4_4_ = (uint)(tStack_28 == 0);
  }
  return tif_local._4_4_;
}

Assistant:

static int LogLuvDecodeTile(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    tmsize_t rowlen = TIFFTileRowSize(tif);

    if (rowlen == 0)
        return 0;

    assert(cc % rowlen == 0);
    while (cc && (*tif->tif_decoderow)(tif, bp, rowlen, s))
    {
        bp += rowlen;
        cc -= rowlen;
    }
    return (cc == 0);
}